

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_NetworkAdapter.cpp
# Opt level: O0

char * axl::io::getNetworkAdapterFlagString(NetworkAdapterFlag flag)

{
  byte bVar1;
  size_t i;
  char *local_18;
  
  bVar1 = sl::getLoBitIdx32(0);
  if ((ulong)bVar1 < 6) {
    local_18 = getNetworkAdapterFlagString::stringTable[bVar1];
  }
  else {
    local_18 = "undefined-adapter-flag";
  }
  return local_18;
}

Assistant:

const char*
getNetworkAdapterFlagString(NetworkAdapterFlag flag) {
	static const char* stringTable[] = {
		"DHCP",      // NetworkAdapterFlag_Dhcp      = 0x01,
		"DDNS",      // NetworkAdapterFlag_Ddns      = 0x02,
		"broadcast", // NetworkAdapterFlag_Broadcast = 0x04,
		"multicast", // NetworkAdapterFlag_Multicast = 0x08,
		"IPv4",      // NetworkAdapterFlag_Ip4       = 0x10,
		"IPv6",      // NetworkAdapterFlag_Ip6       = 0x20,
	};

	size_t i = sl::getLoBitIdx32(flag);
	return i < countof(stringTable) ?
		stringTable[i] :
		"undefined-adapter-flag";
}